

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::semaphore::try_release(semaphore *this,long releaseCount)

{
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 local_10;
  
  for (local_10 = in_RSI; 0 < local_10; local_10 = local_10 + -1) {
    sem_post((sem_t *)*in_RDI);
  }
  return;
}

Assistant:

void semaphore::try_release(long releaseCount) {
  CRNLIB_ASSERT(releaseCount >= 1);

#ifdef WIN32
  if (1 == releaseCount)
    sem_post(m_sem);
  else
    sem_post_multiple(m_sem, releaseCount);
#else
  while (releaseCount > 0) {
    sem_post(m_sem);
    releaseCount--;
  }
#endif
}